

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3443::Calc_Sxi_xi_compact
          (ChElementShellANCF_3443 *this,VectorN *Sxi_xi_compact,double xi,double eta,double zeta,
          double thickness,double zoffset)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar24 [64];
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qb;
  undefined8 in_XMM4_Qb;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  auVar24._8_56_ = in_register_00001248;
  auVar24._0_8_ = eta;
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = xi;
  dVar2 = eta + -1.0;
  auVar20 = auVar24._0_16_;
  auVar11 = vfmadd213sd_fma(auVar20,auVar20,auVar20);
  auVar17 = auVar19._0_16_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = xi * 3.0;
  auVar11 = vfmadd231sd_fma(auVar11,auVar29,auVar17);
  auVar11 = vaddsd_avx512f(auVar11,ZEXT816(0xc008000000000000));
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2 * -0.125;
  auVar12 = vmulsd_avx512f(auVar28,auVar11);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0] = auVar12._0_8_;
  auVar13 = vfmadd213sd_avx512f(ZEXT816(0x4008000000000000),auVar17,ZEXT816(0x3ff0000000000000));
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[1] = (xi + -1.0) * this->m_lenX * -0.0625 * auVar13._0_8_ * dVar2;
  auVar14 = vaddsd_avx512f(auVar20,ZEXT816(0x3ff0000000000000));
  dVar26 = auVar14._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[2] = dVar26 * this->m_lenY * -0.0625 * dVar2 * dVar2;
  auVar27 = ZEXT816(0xc000000000000000);
  auVar7._8_8_ = in_XMM4_Qb;
  auVar7._0_8_ = zoffset;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = this->m_thicknessZ;
  auVar12 = vfmadd231sd_avx512f(auVar31,auVar7,auVar27);
  auVar3._8_8_ = in_XMM3_Qb;
  auVar3._0_8_ = thickness;
  auVar12 = vsubsd_avx512f(auVar12,auVar3);
  auVar15._8_8_ = in_XMM2_Qb;
  auVar15._0_8_ = zeta;
  auVar4._8_8_ = in_XMM3_Qb;
  auVar4._0_8_ = thickness;
  auVar12 = vfnmadd231sd_avx512f(auVar12,auVar4,auVar15);
  auVar12 = vmulsd_avx512f(auVar28,auVar12);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[3] = auVar12._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  auVar15 = vmulsd_avx512f(auVar25,ZEXT816(0x3fc0000000000000));
  auVar11 = vmulsd_avx512f(auVar15,auVar11);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).
           m_storage.m_data.array + 4;
  vmovsd_avx512f(auVar11);
  *pdVar1 = *pdVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = this->m_lenX;
  auVar11 = vmulsd_avx512f(ZEXT816(0xbfb0000000000000),auVar11);
  auVar16 = vaddsd_avx512f(auVar17,ZEXT816(0x3ff0000000000000));
  auVar12 = vmulsd_avx512f(auVar16,auVar11);
  auVar11 = vfmadd213sd_fma(ZEXT816(0x4008000000000000),auVar17,ZEXT816(0xbff0000000000000));
  auVar12 = vmulsd_avx512f(auVar11,auVar12);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[5] = auVar12._0_8_ * dVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = this->m_lenY;
  auVar12 = vmulsd_avx512f(ZEXT816(0x3fb0000000000000),auVar12);
  auVar12 = vmulsd_avx512f(auVar14,auVar12);
  auVar12 = vmulsd_avx512f(auVar25,auVar12);
  auVar12 = vmulsd_avx512f(auVar25,auVar12);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).
           m_storage.m_data.array + 6;
  vmovsd_avx512f(auVar12);
  *pdVar1 = *pdVar1;
  auVar8._8_8_ = in_XMM4_Qb;
  auVar8._0_8_ = zoffset;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = this->m_thicknessZ;
  auVar12 = vfmadd231sd_avx512f(auVar30,auVar8,auVar27);
  auVar5._8_8_ = in_XMM3_Qb;
  auVar5._0_8_ = thickness;
  auVar12 = vsubsd_avx512f(auVar12,auVar5);
  auVar14._8_8_ = in_XMM2_Qb;
  auVar14._0_8_ = zeta;
  auVar6._8_8_ = in_XMM3_Qb;
  auVar6._0_8_ = thickness;
  auVar12 = vfnmadd231sd_avx512f(auVar12,auVar6,auVar14);
  auVar12 = vmulsd_avx512f(auVar15,auVar12);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).
           m_storage.m_data.array + 7;
  vmovsd_avx512f(auVar12);
  *pdVar1 = *pdVar1;
  auVar12 = vfmsub213sd_fma(auVar20,auVar20,auVar20);
  auVar12 = vfmadd231sd_fma(auVar12,auVar29,auVar17);
  auVar12 = vaddsd_avx512f(auVar12,ZEXT816(0xc008000000000000));
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[8] = dVar26 * -0.125 * auVar12._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = this->m_lenX * 0.0625;
  auVar15 = vmulsd_avx512f(auVar16,auVar21);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[9] = dVar26 * auVar11._0_8_ * auVar15._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[10] = dVar26 * dVar26 * dVar2 * this->m_lenY * 0.0625;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = this->m_thicknessZ;
  auVar9._8_8_ = in_XMM4_Qb;
  auVar9._0_8_ = zoffset;
  auVar11 = vfmadd231sd_fma(auVar22,auVar9,auVar27);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar11._0_8_ - thickness;
  auVar16._8_8_ = in_XMM2_Qb;
  auVar16._0_8_ = zeta;
  auVar20._8_8_ = in_XMM3_Qb;
  auVar20._0_8_ = thickness;
  auVar11 = vfnmadd231sd_fma(auVar23,auVar20,auVar16);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xb] = dVar26 * -0.125 * auVar11._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xc] = dVar26 * 0.125 * auVar12._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xd] = dVar26 * (xi + -1.0) * auVar13._0_8_ * this->m_lenX * 0.0625;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xe] = dVar26 * dVar26 * dVar2 * this->m_lenY * -0.0625;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->m_thicknessZ;
  auVar10._8_8_ = in_XMM4_Qb;
  auVar10._0_8_ = zoffset;
  auVar11 = vfmadd213sd_fma(auVar27,auVar10,auVar13);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar11._0_8_ - thickness;
  auVar17._8_8_ = in_XMM2_Qb;
  auVar17._0_8_ = zeta;
  auVar27._8_8_ = in_XMM3_Qb;
  auVar27._0_8_ = thickness;
  auVar11 = vfnmadd231sd_fma(auVar18,auVar27,auVar17);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_16,_1,_0,_16,_1>_>).m_storage.m_data.
  array[0xf] = dVar26 * 0.125 * auVar11._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3443::Calc_Sxi_xi_compact(VectorN& Sxi_xi_compact,
                                                  double xi,
                                                  double eta,
                                                  double zeta,
                                                  double thickness,
                                                  double zoffset) {
    Sxi_xi_compact(0) = -0.125 * (eta - 1) * (eta * eta + eta + 3 * xi * xi - 3);
    Sxi_xi_compact(1) = -0.0625 * m_lenX * (3 * xi + 1) * (xi - 1) * (eta - 1);
    Sxi_xi_compact(2) = -0.0625 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1);
    Sxi_xi_compact(3) = -0.125 * (eta - 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);

    Sxi_xi_compact(4) = 0.125 * (eta - 1) * (eta * eta + eta + 3 * xi * xi - 3);
    Sxi_xi_compact(5) = -0.0625 * m_lenX * (xi + 1) * (3 * xi - 1) * (eta - 1);
    Sxi_xi_compact(6) = 0.0625 * m_lenY * (eta + 1) * (eta - 1) * (eta - 1);
    Sxi_xi_compact(7) = 0.125 * (eta - 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);

    Sxi_xi_compact(8) = -0.125 * (eta + 1) * (eta * eta - eta + 3 * xi * xi - 3);
    Sxi_xi_compact(9) = 0.0625 * m_lenX * (xi + 1) * (3 * xi - 1) * (eta + 1);
    Sxi_xi_compact(10) = 0.0625 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1);
    Sxi_xi_compact(11) = -0.125 * (eta + 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);

    Sxi_xi_compact(12) = 0.125 * (eta + 1) * (eta * eta - eta + 3 * xi * xi - 3);
    Sxi_xi_compact(13) = 0.0625 * m_lenX * (3 * xi + 1) * (xi - 1) * (eta + 1);
    Sxi_xi_compact(14) = -0.0625 * m_lenY * (eta - 1) * (eta + 1) * (eta + 1);
    Sxi_xi_compact(15) = 0.125 * (eta + 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
}